

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O1

void __thiscall Pl_SHA2::resetBits(Pl_SHA2 *this,int bits)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  logic_error *this_01;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  if (this->in_progress == true) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"bit reset requested for in-progress SHA2 Pipeline");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QPDFCryptoProvider::getImpl();
  this_00 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_20;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  peVar1 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_QPDFCryptoImpl[7])(peVar1,bits);
  return;
}

Assistant:

void
Pl_SHA2::resetBits(int bits)
{
    if (this->in_progress) {
        throw std::logic_error("bit reset requested for in-progress SHA2 Pipeline");
    }
    this->crypto = QPDFCryptoProvider::getImpl();
    this->crypto->SHA2_init(bits);
}